

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProtocol.cpp
# Opt level: O2

void __thiscall mognetwork::protocol::TextProtocol::flushReader(TextProtocol *this)

{
  ReadedDatas *pRVar1;
  ReadedDatas RStack_38;
  
  TcpSocket::ReadedDatas::ReadedDatas(&RStack_38);
  TcpSocket::ReadedDatas::operator=(&(this->super_AProtocolListener).m_pendingDatas,&RStack_38);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&RStack_38.datas.super__Vector_base<char,_std::allocator<char>_>);
  pRVar1 = this->m_fullDatas;
  if (pRVar1 != (ReadedDatas *)0x0) {
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&(pRVar1->datas).super__Vector_base<char,_std::allocator<char>_>);
    operator_delete(pRVar1);
  }
  this->m_fullDatas = (ReadedDatas *)0x0;
  return;
}

Assistant:

void TextProtocol::flushReader()
    {
      m_pendingDatas = TcpSocket::ReadedDatas();
      if (m_fullDatas != NULL)
	delete m_fullDatas;
      m_fullDatas = NULL;
    }